

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Datetime.cpp
# Opt level: O2

int Datetime::dayOfWeek(string *input)

{
  bool bVar1;
  int iVar2;
  uint i;
  ulong uVar3;
  
  if (minimumMatchLength == 0) {
    minimumMatchLength = 3;
  }
  uVar3 = 0;
  while ((iVar2 = -1,
         uVar3 < (ulong)((long)dayNames_abi_cxx11_.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)dayNames_abi_cxx11_.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 5) &&
         (bVar1 = closeEnough(dayNames_abi_cxx11_.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + uVar3,input,
                              minimumMatchLength), iVar2 = (int)uVar3, !bVar1))) {
    uVar3 = (ulong)((int)uVar3 + 1);
  }
  return iVar2;
}

Assistant:

int Datetime::dayOfWeek (const std::string& input)
{
  if (Datetime::minimumMatchLength== 0)
    Datetime::minimumMatchLength = 3;

  for (unsigned int i = 0; i < dayNames.size (); ++i)
    if (closeEnough (dayNames[i], input, Datetime::minimumMatchLength))
       return i;

  return -1;
}